

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnklog.cpp
# Opt level: O0

void gnilk::Logger::DisableLogger(string *name)

{
  bool bVar1;
  LogManager *name_00;
  element_type *this;
  undefined1 local_20 [8];
  Ref log;
  string *name_local;
  
  log.super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name;
  name_00 = LogManager::Instance();
  LogManager::GetExistingLog((LogManager *)local_20,(string *)name_00);
  bVar1 = std::operator==((shared_ptr<gnilk::Log> *)local_20,(nullptr_t)0x0);
  if (!bVar1) {
    this = std::__shared_ptr_access<gnilk::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gnilk::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_20);
    Log::SetEnabled(this,false);
  }
  std::shared_ptr<gnilk::Log>::~shared_ptr((shared_ptr<gnilk::Log> *)local_20);
  return;
}

Assistant:

void Logger::DisableLogger(const std::string &name) {
    auto log = LogManager::Instance().GetExistingLog(name);
    if (log == nullptr) {
        return;
    }
    log->SetEnabled(false);
}